

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::GetSyncConditionTest::iterate(GetSyncConditionTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLSyncKHR pvVar3;
  MessageBuilder *pMVar4;
  TestError *this_00;
  MessageBuilder local_340;
  int local_1bc;
  char *pcStack_1b8;
  EGLint condition;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  GetSyncConditionTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar3 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar3;
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pcStack_1b8 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe48);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])0x580c83);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  dVar1 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar1,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,800);
  local_1bc = 0;
  do {
    (*(code *)log->m_log[7].lock)
              (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,0x30f8,
               &local_1bc);
    dVar1 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar1,
                     "getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_CONDITION_KHR, &condition)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x323);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::TestLog::operator<<(&local_340,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [21])0x580e2c);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [28])0x580e52);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1bc);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x57e0e9);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  while( true ) {
    dVar2 = ::deGetFalse();
    if ((dVar2 != 0) || (local_1bc != 0x30f0)) break;
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"condition == EGL_SYNC_PRIOR_COMMANDS_COMPLETE_KHR",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
             ,0x326);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult	iterate					(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint condition = 0;
		EGLU_CHECK_CALL(egl, getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_CONDITION_KHR, &condition));
		log << TestLog::Message << "eglGetSyncAttribKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SYNC_CONDITION_KHR, {" << condition << "})" << TestLog::EndMessage;

		TCU_CHECK(condition == EGL_SYNC_PRIOR_COMMANDS_COMPLETE_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}